

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::preserveObjectStreams(QPDFWriter *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  element_type *peVar3;
  long lVar4;
  int iVar5;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *pmVar6;
  Object *pOVar7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  _Rb_tree_color _Var10;
  ulong uVar11;
  const_iterator iter;
  vector<bool,_std::allocator<bool>_> local_58;
  
  pmVar6 = QPDF::getXRefTableInternal
                     (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->pdf);
  p_Var1 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar3->obj).streams_empty = true;
  p_Var8 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (peVar3->preserve_unreferenced_objects == true) {
    for (; (_Rb_tree_header *)p_Var8 != p_Var1;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var8[1]._M_parent);
      if (iVar5 == 2) {
        (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->obj
        ).streams_empty = false;
        iVar5 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var8[1]._M_parent);
        peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        uVar11 = (ulong)(int)p_Var8[1]._M_color;
        lVar4 = *(long *)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          ._M_impl;
        uVar9 = ((long)*(pointer *)
                        ((long)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                                super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                .
                                super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                        + 8) - lVar4 >> 2) * -0x5555555555555555;
        if (uVar9 < uVar11 || uVar9 - uVar11 == 0) {
          pOVar7 = ObjTable<QPDFWriter::Object>::large_element
                             (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,uVar11);
        }
        else {
          pOVar7 = (Object *)(lVar4 + uVar11 * 0xc);
        }
        pOVar7->object_stream = iVar5;
      }
    }
  }
  else {
    for (; (_Rb_tree_header *)p_Var8 != p_Var1;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var8[1]._M_parent);
      if (iVar5 == 2) {
        peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (peVar3->obj).streams_empty = false;
        QPDF::getCompressibleObjSet(&local_58,peVar3->pdf);
        for (p_Var8 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != p_Var1;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var8[1]._M_parent);
          if (iVar5 == 2) {
            _Var2 = p_Var8[1]._M_color;
            uVar9 = (ulong)(int)_Var2;
            if (uVar9 < (ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                        + ((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                          (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8
               ) {
              _Var10 = _Var2 + 0x3f;
              if (-1 < (int)_Var2) {
                _Var10 = _Var2;
              }
              if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(long)((int)_Var10 >> 6) +
                    ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar9 & 0x3f) & 1) != 0) {
                iVar5 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var8[1]._M_parent);
                peVar3 = (this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                uVar11 = (ulong)(int)p_Var8[1]._M_color;
                lVar4 = *(long *)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                                  super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                  .
                                  super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                  ._M_impl;
                uVar9 = ((long)*(pointer *)
                                ((long)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                                        super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                        .
                                        super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                + 8) - lVar4 >> 2) * -0x5555555555555555;
                if (uVar9 < uVar11 || uVar9 - uVar11 == 0) {
                  pOVar7 = ObjTable<QPDFWriter::Object>::large_element
                                     (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,uVar11);
                }
                else {
                  pOVar7 = (Object *)(lVar4 + uVar11 * 0xc);
                }
                pOVar7->object_stream = iVar5;
              }
            }
          }
        }
        if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p == (_Bit_type *)0x0) {
          return;
        }
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        return;
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::preserveObjectStreams()
{
    auto const& xref = QPDF::Writer::getXRefTable(m->pdf);
    // Our object_to_object_stream map has to map ObjGen -> ObjGen since we may be generating object
    // streams out of old objects that have generation numbers greater than zero. However in an
    // existing PDF, all object stream objects and all objects in them must have generation 0
    // because the PDF spec does not provide any way to do otherwise. This code filters out objects
    // that are not allowed to be in object streams. In addition to removing objects that were
    // erroneously included in object streams in the source PDF, it also prevents unreferenced
    // objects from being included.
    auto end = xref.cend();
    m->obj.streams_empty = true;
    if (m->preserve_unreferenced_objects) {
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams preserve unreferenced");
                m->obj.streams_empty = false;
                m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
            }
        }
    } else {
        // Start by scanning for first compressed object in case we don't have any object streams to
        // process.
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams");
                m->obj.streams_empty = false;
                auto eligible = QPDF::Writer::getCompressibleObjSet(m->pdf);
                // The object pointed to by iter may be a previous generation, in which case it is
                // removed by getCompressibleObjSet. We need to restart the loop (while the object
                // table may contain multiple generations of an object).
                for (iter = xref.cbegin(); iter != end; ++iter) {
                    if (iter->second.getType() == 2) {
                        auto id = static_cast<size_t>(iter->first.getObj());
                        if (id < eligible.size() && eligible[id]) {
                            m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
                        } else {
                            QTC::TC("qpdf", "QPDFWriter exclude from object stream");
                        }
                    }
                }
                return;
            }
        }
    }
}